

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

Printer * __thiscall cppgenerate::Printer::print(Printer *this)

{
  bool bVar1;
  reference this_00;
  Class *cls;
  iterator __end1;
  iterator __begin1;
  vector<cppgenerate::Class,_std::allocator<cppgenerate::Class>_> *__range1;
  Printer *this_local;
  
  __end1 = std::vector<cppgenerate::Class,_std::allocator<cppgenerate::Class>_>::begin
                     (&this->m_classes);
  cls = (Class *)std::vector<cppgenerate::Class,_std::allocator<cppgenerate::Class>_>::end
                           (&this->m_classes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cppgenerate::Class_*,_std::vector<cppgenerate::Class,_std::allocator<cppgenerate::Class>_>_>
                                     *)&cls), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<cppgenerate::Class_*,_std::vector<cppgenerate::Class,_std::allocator<cppgenerate::Class>_>_>
              ::operator*(&__end1);
    Class::print(this_00,(ostream *)&std::cout,(ostream *)&std::cout);
    __gnu_cxx::
    __normal_iterator<cppgenerate::Class_*,_std::vector<cppgenerate::Class,_std::allocator<cppgenerate::Class>_>_>
    ::operator++(&__end1);
  }
  return this;
}

Assistant:

Printer& Printer::print(){
    //std::ostream single;

    if( m_generateAsSingleFile ){
        //single = std::ostream( "jksldaf" );
    }

    for( const Class& cls : m_classes ){
        //std::ostream output( std::cout );

        //if( m_generateAsSingleFile ) output = single;
        cls.print( std::cout, std::cout );
    }
    return *this;
}